

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O2

BN * gcdEuclidean(BN *__return_storage_ptr__,BN *a,BN *b)

{
  bool bVar1;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> _Stack_38;
  
  while( true ) {
    bVar1 = BN::is0(b);
    if (bVar1) break;
    BN::operator%((BN *)&_Stack_38,a,b);
    BN::operator=(a,(BN *)&_Stack_38);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&_Stack_38);
    BN::swap(a,b);
  }
  BN::BN(__return_storage_ptr__,a);
  return __return_storage_ptr__;
}

Assistant:

BN gcdEuclidean(BN a,BN b)
{
    while(!b.is0()) {
        a = a % b;
        a.swap(b);
    }
    return a;
}